

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GEOM ref_geom;
  REF_ADJ pRVar3;
  REF_CELL ref_cell;
  REF_INT *pRVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  char *pcVar11;
  long lVar12;
  uint unaff_R13D;
  REF_INT node;
  long lVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  REF_INT ncell;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_INT cell_list [2];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  REF_GLOB *local_38;
  
  pRVar2 = ref_grid->node;
  local_40 = (long)pRVar2->max;
  if (0 < local_40) {
    ref_geom = ref_grid->geom;
    local_38 = pRVar2->global;
    lVar13 = 0;
    do {
      if (local_38[lVar13] < 0) {
        if ((lVar13 < ref_geom->ref_adj->nnode) && (ref_geom->ref_adj->first[lVar13] != -1)) {
          pcVar11 = "invalid node has geom";
          uVar9 = 0x818;
          goto LAB_00177591;
        }
      }
      else {
        node = (REF_INT)lVar13;
        ref_geom_is_a(ref_geom,node,0,&local_4c);
        ref_geom_is_a(ref_geom,node,1,&local_50);
        ref_geom_is_a(ref_geom,node,2,&local_54);
        pRVar3 = ref_grid->cell[3]->ref_adj;
        if ((((lVar13 < pRVar3->nnode) && (pRVar3->first[lVar13] != -1)) ||
            ((pRVar3 = ref_grid->cell[4]->ref_adj, lVar13 < pRVar3->nnode &&
             (pRVar3->first[lVar13] != -1)))) ||
           ((pRVar3 = ref_grid->cell[5]->ref_adj, lVar13 < pRVar3->nnode &&
            (pRVar3->first[lVar13] != -1)))) {
          bVar16 = false;
        }
        else {
          pRVar3 = ref_grid->cell[6]->ref_adj;
          bVar16 = true;
          if (lVar13 < pRVar3->nnode) {
            bVar16 = pRVar3->first[lVar13] == -1;
          }
        }
        pRVar3 = ref_grid->cell[0]->ref_adj;
        if (((lVar13 < pRVar3->nnode) && (pRVar3->first[lVar13] != -1)) ||
           ((pRVar3 = ref_grid->cell[1]->ref_adj, lVar13 < pRVar3->nnode &&
            (pRVar3->first[lVar13] != -1)))) {
          bVar15 = false;
        }
        else {
          pRVar3 = ref_grid->cell[2]->ref_adj;
          bVar15 = true;
          if (lVar13 < pRVar3->nnode) {
            bVar15 = pRVar3->first[lVar13] == -1;
          }
        }
        if (local_4c != 0) {
          if ((bVar15) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) {
            pcVar11 = "geom node missing edge";
            uVar9 = 0x7c2;
            goto LAB_00177591;
          }
          if ((bVar16) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) {
            pcVar11 = "geom node missing tri or qua";
            uVar9 = 0x7c5;
            goto LAB_00177591;
          }
        }
        if (local_50 != 0) {
          if ((bVar15) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) {
            uVar7 = ref_grid_tattle(ref_grid,node);
            uVar8 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar11 = "tattle";
              uVar9 = 0x7ca;
              goto LAB_00177564;
            }
            uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x7cc,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
              return uVar7;
            }
            pcVar11 = "geom edge missing edge";
            uVar9 = 0x7cd;
            goto LAB_00177591;
          }
          if ((bVar16) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) {
            uVar7 = ref_grid_tattle(ref_grid,node);
            uVar8 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar11 = "tattle";
              uVar9 = 2000;
              goto LAB_00177564;
            }
            uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x7d2,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
              return uVar7;
            }
            pcVar11 = "geom edge missing tri or qua";
            uVar9 = 0x7d3;
            goto LAB_00177591;
          }
        }
        if (((bool)(local_54 != 0 & bVar16)) && (pRVar2->ref_mpi->id == pRVar2->part[lVar13])) {
          puts("no face for geom");
          uVar7 = ref_grid_tattle(ref_grid,node);
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            pcVar11 = "tattle";
            uVar9 = 0x7d9;
LAB_00177564:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar9,"ref_geom_verify_topo",uVar8,pcVar11);
            return (REF_STATUS)uVar8;
          }
          uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7db,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
            return uVar7;
          }
          pcVar11 = "geom face missing tri or qua";
          uVar9 = 0x7dc;
LAB_00177591:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar9,"ref_geom_verify_topo",pcVar11);
          return 1;
        }
        if (!bVar15 && local_50 == 0) {
          puts("no geom for edge");
          uVar7 = ref_grid_tattle(ref_grid,node);
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            pcVar11 = "tattle";
            uVar9 = 0x7e2;
            goto LAB_00177564;
          }
          uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7e4,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
            return uVar7;
          }
          pcVar11 = "geom edge missing for edg";
          uVar9 = 0x7e5;
          goto LAB_00177591;
        }
        if ((!bVar16 && local_54 == 0) && (ref_geom->meshlink == (void *)0x0)) {
          puts("no geom for face");
          uVar7 = ref_grid_tattle(ref_grid,node);
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            pcVar11 = "tattle";
            uVar9 = 0x7eb;
            goto LAB_00177564;
          }
          uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x7ed,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
            return uVar7;
          }
          pcVar11 = "geom face missing tri or qua";
          uVar9 = 0x7ee;
          goto LAB_00177591;
        }
        if (local_4c == 0 && local_50 != 0) {
          pRVar3 = ref_geom->ref_adj;
          RVar10 = -1;
          uVar8 = 0xffffffff;
          if (lVar13 < pRVar3->nnode) {
            uVar8 = (ulong)(uint)pRVar3->first[lVar13];
          }
          iVar14 = (int)uVar8;
          if (iVar14 != -1) {
            RVar10 = pRVar3->item[iVar14].ref;
          }
          unaff_R13D = 0;
          if (iVar14 == -1) {
            bVar16 = true;
          }
          else {
            bVar5 = 0;
            do {
              bVar6 = 1;
              if (unaff_R13D == 0) {
                bVar6 = bVar5;
              }
              if (ref_geom->descr[RVar10 * 6] == 1) {
                unaff_R13D = 1;
                bVar5 = bVar6;
              }
              iVar14 = pRVar3->item[(int)uVar8].next;
              uVar8 = (ulong)iVar14;
              if (uVar8 == 0xffffffffffffffff) {
                RVar10 = -1;
              }
              else {
                RVar10 = pRVar3->item[uVar8].ref;
              }
            } while (iVar14 != -1);
            bVar16 = unaff_R13D == 0;
            unaff_R13D = (uint)bVar5;
          }
          if ((bVar16) || ((char)unaff_R13D != '\0')) {
            if (bVar16) {
              puts("none found");
            }
            if ((char)unaff_R13D != '\0') {
              puts("found too many");
            }
            uVar7 = ref_grid_tattle(ref_grid,node);
            uVar8 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar11 = "tatt";
              uVar9 = 0x7fd;
              goto LAB_00177564;
            }
            uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x7ff,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
              return uVar7;
            }
            pcVar11 = "multiple geom edge away from geom node";
            uVar9 = 0x800;
            goto LAB_00177591;
          }
        }
        if (local_54 != 0 && local_50 == 0) {
          pRVar3 = ref_geom->ref_adj;
          RVar10 = -1;
          uVar8 = 0xffffffff;
          if (lVar13 < pRVar3->nnode) {
            uVar8 = (ulong)(uint)pRVar3->first[lVar13];
          }
          iVar14 = (int)uVar8;
          if (iVar14 != -1) {
            RVar10 = pRVar3->item[iVar14].ref;
          }
          unaff_R13D = 0;
          if (iVar14 == -1) {
            bVar16 = true;
          }
          else {
            bVar5 = 0;
            do {
              bVar6 = 1;
              if (unaff_R13D == 0) {
                bVar6 = bVar5;
              }
              if (ref_geom->descr[RVar10 * 6] == 2) {
                unaff_R13D = 1;
                bVar5 = bVar6;
              }
              iVar14 = pRVar3->item[(int)uVar8].next;
              uVar8 = (ulong)iVar14;
              if (uVar8 == 0xffffffffffffffff) {
                RVar10 = -1;
              }
              else {
                RVar10 = pRVar3->item[uVar8].ref;
              }
            } while (iVar14 != -1);
            bVar16 = unaff_R13D == 0;
            unaff_R13D = (uint)bVar5;
          }
          if ((bVar16) || ((char)unaff_R13D != '\0')) {
            if (bVar16) {
              puts("none found");
            }
            if ((char)unaff_R13D != '\0') {
              puts("found too many");
            }
            uVar7 = ref_grid_tattle(ref_grid,node);
            uVar8 = (ulong)uVar7;
            if (uVar7 != 0) {
              pcVar11 = "tattle";
              uVar9 = 0x810;
              goto LAB_00177564;
            }
            uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x812,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
              return uVar7;
            }
            pcVar11 = "multiple geom face away from geom edge";
            uVar9 = 0x813;
            goto LAB_00177591;
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != local_40);
  }
  ref_cell = ref_grid->cell[0];
  if (0 < ref_cell->max) {
    iVar14 = 0;
    do {
      lVar12 = (long)iVar14;
      lVar13 = ref_cell->size_per * lVar12;
      iVar1 = ref_cell->c2n[lVar13];
      if (iVar1 != -1) {
        uVar7 = ref_cell_list_with2(ref_cell,iVar1,ref_cell->c2n[lVar13 + 1],2,&local_58,&local_48);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x821,"ref_geom_verify_topo",(ulong)uVar7,"edge list for edge");
          return uVar7;
        }
        if (local_58 == 2) {
          puts("error: two edg found with same nodes");
          pRVar4 = ref_cell->c2n;
          lVar13 = (long)ref_cell->size_per * (long)local_48;
          printf("edg %d n %d %d id %d\n",(long)local_48,(ulong)(uint)pRVar4[lVar13],
                 (ulong)(uint)pRVar4[lVar13 + 1],(ulong)(uint)pRVar4[lVar13 + 2]);
          pRVar4 = ref_cell->c2n;
          lVar13 = (long)ref_cell->size_per * (long)local_44;
          printf("edg %d n %d %d id %d\n",(long)local_44,(ulong)(uint)pRVar4[lVar13],
                 (ulong)(uint)pRVar4[lVar13 + 1],(ulong)(uint)pRVar4[lVar13 + 2]);
          uVar7 = ref_grid_tattle(ref_grid,ref_cell->c2n[ref_cell->size_per * lVar12]);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x82c,"ref_geom_verify_topo",(ulong)uVar7,"tattle");
            return uVar7;
          }
          uVar7 = ref_grid_tattle(ref_grid,ref_cell->c2n[ref_cell->size_per * lVar12 + 1]);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x82d,"ref_geom_verify_topo",(ulong)uVar7,"tattle");
            return uVar7;
          }
          uVar7 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x82e,"ref_geom_verify_topo",(ulong)uVar7,"geom tec");
            return uVar7;
          }
        }
        iVar1 = local_58;
        if ((long)local_58 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x830,"ref_geom_verify_topo","expect only one edge cell for two nodes",1,
                 (long)local_58);
          unaff_R13D = 1;
        }
        if (iVar1 != 1) {
          return unaff_R13D;
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, geom;
  REF_BOOL geom_node, geom_edge, geom_face;
  REF_BOOL no_face, no_edge;
  REF_BOOL found_one;
  REF_BOOL found_too_many;
  REF_INT cell, ncell, cell_list[2];

  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (ref_node_valid(ref_node, node)) {
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face");
      no_face = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr3(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_qua(ref_grid), node);
      no_edge = ref_cell_node_empty(ref_grid_edg(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed3(ref_grid), node);
      if (geom_node) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          THROW("geom node missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          THROW("geom node missing tri or qua");
        }
      }
      if (geom_edge) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing tri or qua");
        }
      }
      if (geom_face) {
        if (no_face && ref_node_owned(ref_node, node)) {
          printf("no face for geom\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (!no_edge) {
        if (!geom_edge) {
          printf("no geom for edge\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing for edg");
        }
      }
      if (!no_face) {
        if (!geom_face && !ref_geom_meshlinked(ref_geom)) {
          printf("no geom for face\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (geom_edge && !geom_node) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_geom_having_node(ref_geom, node, item, geom) {
          if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tatt");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom edge away from geom node");
        }
      }
      if (geom_face && !geom_edge) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item,
                                        geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom face away from geom edge");
        }
      }
    } else {
      if (!ref_adj_empty(ref_geom_adj(ref_geom), node))
        THROW("invalid node has geom");
    }
  }

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_list_with2(ref_cell, ref_cell_c2n(ref_cell, 0, cell),
                            ref_cell_c2n(ref_cell, 1, cell), 2, &ncell,
                            cell_list),
        "edge list for edge");
    if (2 == ncell) {
      printf("error: two edg found with same nodes\n");
      printf("edg %d n %d %d id %d\n", cell_list[0],
             ref_cell_c2n(ref_cell, 0, cell_list[0]),
             ref_cell_c2n(ref_cell, 1, cell_list[0]),
             ref_cell_c2n(ref_cell, 2, cell_list[0]));
      printf("edg %d n %d %d id %d\n", cell_list[1],
             ref_cell_c2n(ref_cell, 0, cell_list[1]),
             ref_cell_c2n(ref_cell, 1, cell_list[1]),
             ref_cell_c2n(ref_cell, 2, cell_list[1]));
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 0, cell)), "tattle");
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 1, cell)), "tattle");
      RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"), "geom tec");
    }
    REIS(1, ncell, "expect only one edge cell for two nodes");
  }

  return REF_SUCCESS;
}